

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_states.hpp
# Opt level: O3

void __thiscall
duckdb::MultiFileReaderData::MultiFileReaderData
          (MultiFileReaderData *this,OpenFileInfo *file_to_be_opened)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_std::mutex_*,_false> _Var3;
  
  (this->closed_reader).internal.
  super___weak_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->closed_reader).internal.
  super___weak_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->reader).internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->reader).internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->file_state = UNOPENED;
  _Var3._M_head_impl = (mutex *)operator_new(0x28);
  *(undefined8 *)((long)&(_Var3._M_head_impl)->super___mutex_base + 0x10) = 0;
  *(undefined8 *)((long)&(_Var3._M_head_impl)->super___mutex_base + 0x18) = 0;
  *(undefined8 *)&(_Var3._M_head_impl)->super___mutex_base = 0;
  *(undefined8 *)((long)&(_Var3._M_head_impl)->super___mutex_base + 8) = 0;
  *(undefined8 *)((long)&(_Var3._M_head_impl)->super___mutex_base + 0x20) = 0;
  (this->file_mutex).super_unique_ptr<std::mutex,_std::default_delete<std::mutex>_>._M_t.
  super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
  super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
  super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl = _Var3._M_head_impl;
  (this->union_data).internal.super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->union_data).internal.super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->constant_map).constant_map.
  super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>.
  super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constant_map).constant_map.
  super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>.
  super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->constant_map).constant_map.
  super_vector<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>.
  super__Vector_base<duckdb::MultiFileConstantEntry,_std::allocator<duckdb::MultiFileConstantEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->expressions).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expressions).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expressions).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->file_to_be_opened).path._M_dataplus._M_p = (pointer)&(this->file_to_be_opened).path.field_2
  ;
  pcVar1 = (file_to_be_opened->path)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file_to_be_opened,pcVar1,
             pcVar1 + (file_to_be_opened->path)._M_string_length);
  (this->file_to_be_opened).extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (file_to_be_opened->extended_info).internal.
       super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (file_to_be_opened->extended_info).internal.
           super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->file_to_be_opened).extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

explicit MultiFileReaderData(const OpenFileInfo &file_to_be_opened)
	    : reader(nullptr), file_state(MultiFileFileState::UNOPENED), file_mutex(make_uniq<mutex>()),
	      file_to_be_opened(file_to_be_opened) {
	}